

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O1

QString * __thiscall
Driver::findOrInsert<DomWidget>
          (QString *__return_storage_ptr__,Driver *this,DomObjectHash<DomWidget> *domHash,
          DomWidget *dom,QString *className,bool isMember)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  piter pVar6;
  DomWidget *copy;
  QStringBuilder<QString_&,_const_QString_&> local_90;
  QString local_80;
  QString local_68;
  DomWidget *local_48;
  DomWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = dom;
  pVar6 = (piter)QHash<DomWidget_const*,QString>::findImpl<DomWidget_const*>
                           ((QHash<DomWidget_const*,QString> *)domHash,&local_48);
  if (pVar6.d == (Data<QHashPrivate::Node<const_DomWidget_*,_QString>_> *)0x0 && pVar6.bucket == 0)
  {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_80.d.d = (local_48->m_attr_name).d.d;
    local_80.d.ptr = (local_48->m_attr_name).d.ptr;
    local_80.d.size = (local_48->m_attr_name).d.size;
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_80.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_80.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    unique(&local_68,this,&local_80,className);
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (isMember) {
      local_90.a = (QString *)&language::self;
      local_90.b = &local_68;
      QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>(&local_80,&local_90);
    }
    else {
      local_80.d.d = local_68.d.d;
      local_80.d.ptr = local_68.d.ptr;
      local_80.d.size = local_68.d.size;
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    local_40 = local_48;
    pVar6 = (piter)QHash<DomWidget_const*,QString>::emplace<QString_const&>
                             ((QHash<DomWidget_const*,QString> *)domHash,&local_40,&local_80);
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pSVar2 = (pVar6.d)->spans;
  uVar5 = pVar6.bucket >> 7;
  pEVar3 = pSVar2[uVar5].entries;
  bVar1 = pSVar2[uVar5].offsets[(uint)pVar6.bucket & 0x7f];
  pDVar4 = *(Data **)(pEVar3[bVar1].storage.data + 8);
  (__return_storage_ptr__->d).d = pDVar4;
  (__return_storage_ptr__->d).ptr = *(char16_t **)(pEVar3[bVar1].storage.data + 0x10);
  (__return_storage_ptr__->d).size = *(qsizetype *)(pEVar3[bVar1].storage.data + 0x18);
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString Driver::findOrInsert(DomObjectHash<DomClass> *domHash, const DomClass *dom,
                             const QString &className, bool isMember)
{
    auto it = domHash->find(dom);
    if (it == domHash->end()) {
        const QString name = this->unique(dom->attributeName(), className);
        it = domHash->insert(dom, isMember ? language::self + name : name);
    }
    return it.value();
}